

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upsync_module.c
# Opt level: O0

ngx_int_t ngx_http_upsync_init_module(ngx_cycle_t *cycle)

{
  ngx_http_upsync_server_t *pnVar1;
  ngx_http_upsync_srv_conf_t *pnVar2;
  ngx_int_t nVar3;
  ngx_http_upsync_srv_conf_t *upscf;
  ngx_http_upsync_server_t *upsync_server;
  ngx_uint_t i;
  ngx_cycle_t *cycle_local;
  
  if (upsync_ctx == (ngx_http_upsync_main_conf_t *)0x0) {
    cycle_local = (ngx_cycle_t *)0x0;
  }
  else {
    pnVar1 = upsync_ctx->upsync_server;
    nVar3 = ngx_http_upsync_init_shm_mutex(cycle);
    if (nVar3 == 0) {
      for (upsync_server = (ngx_http_upsync_server_t *)0x0;
          upsync_server < (ngx_http_upsync_server_t *)upsync_ctx->upstream_num;
          upsync_server = (ngx_http_upsync_server_t *)((long)&(upsync_server->host).len + 1)) {
        pnVar2 = pnVar1[(long)upsync_server].upscf;
        if (pnVar2->conf_file->fd != -1) {
          close(pnVar2->conf_file->fd);
          pnVar2->conf_file->fd = -1;
        }
        chmod((char *)(pnVar2->upsync_dump_path).data,0x1a6);
      }
      cycle_local = (ngx_cycle_t *)0x0;
    }
    else {
      if (3 < cycle->log->log_level) {
        ngx_log_error_core(4,cycle->log,0,"upsync_init_module: init shm mutex failed");
      }
      cycle_local = (ngx_cycle_t *)0xffffffffffffffff;
    }
  }
  return (ngx_int_t)cycle_local;
}

Assistant:

static ngx_int_t 
ngx_http_upsync_init_module(ngx_cycle_t *cycle)
{
    ngx_uint_t                       i;
    ngx_http_upsync_server_t        *upsync_server;
    ngx_http_upsync_srv_conf_t      *upscf;

    // no http {} block found
    if (upsync_ctx == NULL) {
        return NGX_OK;
    }
    upsync_server = upsync_ctx->upsync_server;

    if (ngx_http_upsync_init_shm_mutex(cycle) != NGX_OK) {
        ngx_log_error(NGX_LOG_ERR, cycle->log, 0, "upsync_init_module:"
                      " init shm mutex failed");
        return NGX_ERROR;
    }

    for (i = 0; i < upsync_ctx->upstream_num; i++) {

        upscf = upsync_server[i].upscf;
        if (upscf->conf_file->fd != NGX_INVALID_FILE) {
            ngx_close_file(upscf->conf_file->fd);
            upscf->conf_file->fd = NGX_INVALID_FILE;
        }
        ngx_change_file_access(upscf->upsync_dump_path.data, 
                               S_IRUSR|S_IWUSR|S_IRGRP|S_IROTH|S_IWOTH);
    }

    return NGX_OK;
}